

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeViewport(ImGuiViewportP *viewport)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  ImDrawList **ppIVar4;
  char *pcVar5;
  char *pcVar6;
  ImGuiID *in_RDI;
  char *pcVar7;
  ImDrawList *draw_list;
  ImDrawList **__end2;
  ImDrawList **__begin2;
  ImVector<ImDrawList_*> *__range2;
  ImGuiWindowFlags flags;
  bool open;
  ImGuiContext *g;
  char *in_stack_00000308;
  ImDrawList *in_stack_00000310;
  ImGuiViewportP *in_stack_00000318;
  ImGuiWindow *in_stack_00000320;
  ImDrawList **local_28;
  ImGuiContext *pIVar8;
  
  pIVar8 = GImGui;
  SetNextItemOpen(true,2);
  bVar2 = TreeNode("viewport0","Viewport #%d",0);
  bVar3 = IsItemHovered((ImGuiHoveredFlags)pIVar8);
  if (bVar3) {
    (pIVar8->DebugMetricsConfig).HighlightViewportID = *in_RDI;
  }
  if (bVar2) {
    uVar1 = in_RDI[1];
    BulletText((char *)(double)(float)in_RDI[2],(double)(float)in_RDI[3],(double)(float)in_RDI[4],
               (double)(float)in_RDI[5],(double)(float)in_RDI[0x2c],(double)(float)in_RDI[0x2d],
               (double)(float)in_RDI[0x2e],(double)(float)in_RDI[0x2f],
               "Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f"
              );
    pcVar6 = "";
    if ((uVar1 & 1) != 0) {
      pcVar6 = " IsPlatformWindow";
    }
    pcVar5 = "";
    if ((uVar1 & 2) != 0) {
      pcVar5 = " IsPlatformMonitor";
    }
    pcVar7 = "";
    if ((uVar1 & 4) != 0) {
      pcVar7 = " OwnedByApp";
    }
    BulletText("Flags: 0x%04X =%s%s%s",(ulong)in_RDI[1],pcVar6,pcVar5,pcVar7);
    local_28 = ImVector<ImDrawList_*>::begin((ImVector<ImDrawList_*> *)(in_RDI + 0x18));
    ppIVar4 = ImVector<ImDrawList_*>::end((ImVector<ImDrawList_*> *)(in_RDI + 0x18));
    for (; local_28 != ppIVar4; local_28 = local_28 + 1) {
      DebugNodeDrawList(in_stack_00000320,in_stack_00000318,in_stack_00000310,in_stack_00000308);
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeViewport(ImGuiViewportP* viewport)
{
    ImGuiContext& g = *GImGui;
    SetNextItemOpen(true, ImGuiCond_Once);
    bool open = TreeNode("viewport0", "Viewport #%d", 0);
    if (IsItemHovered())
        g.DebugMetricsConfig.HighlightViewportID = viewport->ID;
    if (open)
    {
        ImGuiWindowFlags flags = viewport->Flags;
        BulletText("Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f",
            viewport->Pos.x, viewport->Pos.y, viewport->Size.x, viewport->Size.y,
            viewport->WorkOffsetMin.x, viewport->WorkOffsetMin.y, viewport->WorkOffsetMax.x, viewport->WorkOffsetMax.y);
        BulletText("Flags: 0x%04X =%s%s%s", viewport->Flags,
            (flags & ImGuiViewportFlags_IsPlatformWindow)  ? " IsPlatformWindow"  : "",
            (flags & ImGuiViewportFlags_IsPlatformMonitor) ? " IsPlatformMonitor" : "",
            (flags & ImGuiViewportFlags_OwnedByApp)        ? " OwnedByApp"        : "");
        for (ImDrawList* draw_list : viewport->DrawDataP.CmdLists)
            DebugNodeDrawList(NULL, viewport, draw_list, "DrawList");
        TreePop();
    }
}